

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::RE2(RE2 *this,char *pattern)

{
  Options local_50;
  StringPiece local_38 [2];
  char *local_18;
  char *pattern_local;
  RE2 *this_local;
  
  local_18 = pattern;
  pattern_local = (char *)this;
  std::__cxx11::string::string((string *)this);
  Options::Options(&this->options_);
  std::__cxx11::string::string((string *)&this->prefix_);
  std::__cxx11::string::string((string *)&this->error_arg_);
  std::once_flag::once_flag(&this->rprog_once_);
  std::once_flag::once_flag(&this->num_captures_once_);
  std::once_flag::once_flag(&this->named_groups_once_);
  std::once_flag::once_flag(&this->group_names_once_);
  StringPiece::StringPiece(local_38,local_18);
  Options::Options(&local_50,DefaultOptions);
  Init(this,local_38,&local_50);
  return;
}

Assistant:

RE2::RE2(const char* pattern) {
  Init(pattern, DefaultOptions);
}